

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::HttpClient::ConnectRequest::Status> * __thiscall
kj::_::NullableValue<kj::HttpClient::ConnectRequest::Status>::operator=
          (NullableValue<kj::HttpClient::ConnectRequest::Status> *this,
          NullableValue<kj::HttpClient::ConnectRequest::Status> *other)

{
  Status *params;
  NullableValue<kj::HttpClient::ConnectRequest::Status> *other_local;
  NullableValue<kj::HttpClient::ConnectRequest::Status> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::HttpClient::ConnectRequest::Status>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::HttpClient::ConnectRequest::Status>(&(other->field_1).value);
      ctor<kj::HttpClient::ConnectRequest::Status,kj::HttpClient::ConnectRequest::Status>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }